

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_batch.cc
# Opt level: O1

void leveldb::WriteBatchInternal::SetContents(WriteBatch *b,Slice *contents)

{
  long in_FS_OFFSET;
  
  if (contents->size_ < 0xc) {
    __assert_fail("contents.size() >= kHeader",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/leveldb/db/write_batch.cc"
                  ,0x8c,
                  "static void leveldb::WriteBatchInternal::SetContents(WriteBatch *, const Slice &)"
                 );
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
              (&b->rep_,0,(b->rep_)._M_string_length,contents->data_,contents->size_);
    return;
  }
  __stack_chk_fail();
}

Assistant:

void WriteBatchInternal::SetContents(WriteBatch* b, const Slice& contents) {
  assert(contents.size() >= kHeader);
  b->rep_.assign(contents.data(), contents.size());
}